

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

int parse_http_headers(char **buf,mg_header *hdr)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  
  lVar4 = 0;
  iVar3 = 0;
  do {
    pcVar8 = *buf;
    pcVar6 = pcVar8 + -1;
    lVar7 = 1;
    do {
      pcVar8 = pcVar8 + 1;
      pcVar1 = pcVar6 + 1;
      pcVar6 = pcVar6 + 1;
      lVar7 = lVar7 + -1;
      if (*pcVar1 == ':') break;
    } while (0xa1 < (byte)(*pcVar1 + 0x81U));
    if (lVar7 == 0) {
LAB_00112944:
      iVar5 = 2;
    }
    else {
      for (; *pcVar6 == ' '; pcVar6 = pcVar6 + 1) {
        *pcVar6 = '\0';
        pcVar8 = pcVar8 + 1;
      }
      if (*pcVar6 == ':') {
        *pcVar6 = '\0';
        hdr[lVar4].name = *buf;
        for (; (*pcVar8 == ' ' || (*pcVar8 == '\t')); pcVar8 = pcVar8 + 1) {
        }
        hdr[lVar4].value = pcVar8;
        while( true ) {
          cVar2 = *pcVar8;
          if ((cVar2 == '\0') || (cVar2 == '\n')) goto LAB_0011291c;
          if (cVar2 == '\r') break;
          pcVar8 = pcVar8 + 1;
        }
        *pcVar8 = '\0';
        iVar5 = 1;
        if (pcVar8[1] != '\n') goto LAB_0011294a;
        pcVar8 = pcVar8 + 1;
LAB_0011291c:
        iVar3 = (int)lVar4 + 1;
        if (*pcVar8 == '\0') {
          *buf = pcVar8;
        }
        else {
          *pcVar8 = '\0';
          *buf = pcVar8 + 1;
          if ((pcVar8[1] != '\n') && (pcVar8[1] != '\r')) {
            iVar5 = 0;
            goto LAB_0011294a;
          }
        }
        goto LAB_00112944;
      }
      iVar5 = 1;
    }
LAB_0011294a:
    if (iVar5 != 0) {
      if (iVar5 == 2) {
        return iVar3;
      }
      return -1;
    }
    lVar4 = lVar4 + 1;
    if (lVar4 == 0x40) {
      return iVar3;
    }
  } while( true );
}

Assistant:

static int
parse_http_headers(char **buf, struct mg_header hdr[MG_MAX_HEADERS])
{
	int i;
	int num_headers = 0;

	for (i = 0; i < (int)MG_MAX_HEADERS; i++) {
		char *dp = *buf;

		/* Skip all ASCII characters (>SPACE, <127), to find a ':' */
		while ((*dp != ':') && (*dp >= 33) && (*dp <= 126)) {
			dp++;
		}
		if (dp == *buf) {
			/* End of headers reached. */
			break;
		}

		/* Drop all spaces after header name before : */
		while (*dp == ' ') {
			*dp = 0;
			dp++;
		}
		if (*dp != ':') {
			/* This is not a valid field. */
			return -1;
		}

		/* End of header key (*dp == ':') */
		/* Truncate here and set the key name */
		*dp = 0;
		hdr[i].name = *buf;

		/* Skip all spaces */
		do {
			dp++;
		} while ((*dp == ' ') || (*dp == '\t'));

		/* The rest of the line is the value */
		hdr[i].value = dp;

		/* Find end of line */
		while ((*dp != 0) && (*dp != '\r') && (*dp != '\n')) {
			dp++;
		};

		/* eliminate \r */
		if (*dp == '\r') {
			*dp = 0;
			dp++;
			if (*dp != '\n') {
				/* This is not a valid line. */
				return -1;
			}
		}

		/* here *dp is either 0 or '\n' */
		/* in any case, we have a new header */
		num_headers = i + 1;

		if (*dp) {
			*dp = 0;
			dp++;
			*buf = dp;

			if ((dp[0] == '\r') || (dp[0] == '\n')) {
				/* This is the end of the header */
				break;
			}
		} else {
			*buf = dp;
			break;
		}
	}
	return num_headers;
}